

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O2

void workspace_hide(natwm_state *state,workspace *workspace)

{
  client *client;
  list *plVar1;
  
  if (workspace->is_visible == true) {
    workspace->is_visible = false;
    workspace->is_focused = false;
    plVar1 = workspace->clients;
    while (plVar1 = (list *)plVar1->head, plVar1 != (list *)0x0) {
      client = (client *)plVar1->size;
      if ((client != (client *)0x0) && ((client->state & CLIENT_HIDDEN) == 0)) {
        client_hide(state,client);
      }
    }
  }
  return;
}

Assistant:

static void workspace_hide(const struct natwm_state *state, struct workspace *workspace)
{
        if (!workspace->is_visible) {
                return;
        }

        workspace->is_focused = false;
        workspace->is_visible = false;

        LIST_FOR_EACH(workspace->clients, node)
        {
                struct client *client = get_client_from_client_node(node);

                if (client == NULL || client->state & CLIENT_HIDDEN) {
                        continue;
                }

                client_hide(state, client);
        }
}